

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManPrintQuit(Mf_Man_t *p,Gia_Man_t *pNew)

{
  Vec_Mem_t *pVVar1;
  long lVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  timespec ts;
  timespec local_28;
  
  dVar9 = Gia_ManMemory(p->pGia);
  pVVar1 = p->vTtMem;
  fVar11 = 0.0;
  fVar10 = 0.0;
  if (pVVar1 != (Vec_Mem_t *)0x0) {
    fVar10 = ((float)pVVar1->nPageAlloc * 8.0 +
              (float)(pVVar1->iPage + 1) *
              (float)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) * (float)pVVar1->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    fVar11 = ((float)pNew->vMapping->nCap * 4.0 + 16.0) * 9.536743e-07;
  }
  iVar6 = p->pGia->nObjs;
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar4 = (float)iVar6 * 16.0 * 9.536743e-07;
    fVar5 = (float)(p->vPages).nSize * 262144.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar9 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar4);
    printf("Cut = %.2f MB   ",(double)fVar5);
    printf("Map = %.2f MB  ",(double)fVar11);
    printf("TT = %.2f MB  ",(double)fVar10);
    printf("Total = %.2f MB",
           (double)((float)(dVar9 * 9.5367431640625e-07) + fVar4 + fVar5 + fVar11 + fVar10));
    putchar(10);
    if (-1 < p->pPars->nLutSize) {
      uVar8 = 0;
      do {
        printf("%d = %d  ",uVar8 & 0xffffffff,(ulong)(uint)p->nCutCounts[uVar8]);
        bVar3 = (long)uVar8 < (long)p->pPars->nLutSize;
        uVar8 = uVar8 + 1;
      } while (bVar3);
    }
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      printf("TT = %d (%.2f %%)  ",((double)p->vTtMem->nEntries * 100.0) / p->CutCount[2]);
    }
    iVar6 = clock_gettime(3,&local_28);
    if (iVar6 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar2 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar7 - lVar2) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Mf_ManPrintQuit( Mf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(Mf_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts  = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCuts + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d = %d  ", i, p->nCutCounts[i] );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    }
    fflush( stdout );
}